

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
tournser::tournser(tournser *this,delta_complex_t *_complex,char *_outname,size_t _max_entries,
                  bool _python)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  size_type __n;
  value_type_conflict1 local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  this->complex = _complex;
  std::ofstream::ofstream(&this->outfile);
  pvVar1 = (this->complex->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->complex->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
  if (pvVar2 == pvVar1) {
    lVar3 = 0;
  }
  else {
    lVar3 = ((long)(pvVar1->
                   super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar1->
                   super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3) * 0x34f72c234f72c235;
  }
  this->n = lVar3;
  this->dim_max = __n - 1;
  (this->coface_entries).super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coface_entries).super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coface_entries).super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_entries = _max_entries;
  (this->skipped_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->skipped_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skipped_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->python = _python;
  (this->finite_pairs).
  super__Vector_base<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->finite_pairs).
  super__Vector_base<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->finite_pairs).
  super__Vector_base<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->infinite_pairs).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->infinite_pairs).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->infinite_pairs).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (!_python) {
    std::ofstream::ofstream(&local_230,_outname,_S_out);
    std::ios::swap((ios *)(&this->outfile + *(long *)(*(long *)&this->outfile + -0x18)));
    std::filebuf::operator=((filebuf *)&this->field_0x10,local_228);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT - 0x18) + -8) = _PyCFunction_Type;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    __n = this->dim_max + 1;
  }
  local_230 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_fill_assign
            (&this->skipped_entries,__n,&local_230);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(&this->infinite_pairs,this->dim_max + 1);
  std::
  vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ::resize(&this->finite_pairs,this->dim_max + 1);
  return;
}

Assistant:

tournser(	delta_complex_t* _complex, char* _outname, size_t _max_entries, bool _python)
	    : complex(_complex), n(complex->number_of_cells(0)),
	      dim_max(complex->top_dimension()),
		  max_entries(_max_entries),
		  python(_python){
				if(!python) {outfile = std::ofstream(_outname);}
				skipped_entries.assign(dim_max+1,0);
				infinite_pairs.resize(dim_max+1);
				finite_pairs.resize(dim_max+1);
			  }